

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::GeometricPrimitive::Intersect(GeometricPrimitive *this,Ray *r,Float tMax)

{
  TextureEvalContext ctx;
  undefined1 auVar1 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  Vector3<float> args_1;
  Point3<float> args;
  bool bVar5;
  ShapeIntersection *pSVar6;
  uint64_t uVar7;
  ShapeIntersection *mi;
  MediumHandle *med;
  GeometricPrimitive *in_RDX;
  long in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  undefined1 auVar8 [64];
  float in_XMM0_Da;
  Float FVar9;
  undefined1 auVar10 [16];
  Ray rNext;
  Float u;
  Float a;
  double vb;
  Float va;
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::ShapeIntersection> *siNext;
  Ray *in_stack_fffffffffffffca8;
  Ray *in_stack_fffffffffffffcb0;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffffcb8;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffffcc0;
  Float in_stack_fffffffffffffccc;
  Ray *in_stack_fffffffffffffcd0;
  ShapeHandle *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce8;
  Vector3f *in_stack_fffffffffffffcf0;
  Interaction *in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  SurfaceInteraction *in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  int line;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  float in_stack_fffffffffffffd20;
  LogLevel in_stack_fffffffffffffd24;
  char (*in_stack_fffffffffffffd30) [9];
  undefined4 in_stack_fffffffffffffd38;
  float fVar11;
  undefined4 in_stack_fffffffffffffd3c;
  char (*in_stack_fffffffffffffd40) [13];
  double *in_stack_fffffffffffffd48;
  undefined1 local_190 [64];
  optional local_128 [260];
  Float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 auVar2 [40];
  
  line = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  ShapeHandle::Intersect
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  bVar5 = pstd::optional::operator_cast_to_bool(local_128);
  if (bVar5) {
    pSVar6 = pstd::optional<pbrt::ShapeIntersection>::operator->
                       ((optional<pbrt::ShapeIntersection> *)0x8469ad);
    if (in_XMM0_Da * 1.001 <= pSVar6->tHit) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (in_stack_fffffffffffffd24,
                 (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),line,
                 (char *)in_stack_fffffffffffffd08,
                 (char (*) [9])CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (char (*) [13])in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                 (float *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
    }
    bVar5 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x28));
    if (bVar5) {
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x846aac);
      TextureEvalContext::TextureEvalContext
                ((TextureEvalContext *)in_stack_fffffffffffffcc0,
                 (SurfaceInteraction *)in_stack_fffffffffffffcb8);
      auVar8 = vmovdqu64_avx512f(local_190);
      auVar8 = vmovdqu64_avx512f(auVar8);
      in_stack_fffffffffffffca8 = auVar8._0_8_;
      in_stack_fffffffffffffcb0 = auVar8._8_8_;
      in_stack_fffffffffffffcb8 = auVar8._16_8_;
      in_stack_fffffffffffffcc0 = auVar8._24_8_;
      auVar2 = auVar8._24_40_;
      ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffce8;
      ctx.dudx = (Float)(int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
      auVar1 = auVar2._0_12_;
      auVar3 = auVar2._12_12_;
      auVar4 = auVar2._24_12_;
      ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar1._0_4_;
      ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar1._4_4_;
      ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar1._8_4_;
      ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar3._0_4_;
      ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar3._4_4_;
      ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar3._8_4_;
      ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar4._0_4_;
      ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar4._4_4_;
      ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar4._8_4_;
      ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar2._36_4_;
      ctx._48_8_ = in_stack_fffffffffffffcf0;
      ctx._56_8_ = in_stack_fffffffffffffcf8;
      FVar9 = FloatTextureHandle::Evaluate((FloatTextureHandle *)in_stack_fffffffffffffcb0,ctx);
      if (FVar9 < 1.0) {
        if (0.0 < FVar9) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               (in_RDX->shape).
               super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
               .bits;
          args.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffd1c;
          args.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffd18;
          args.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd20;
          args_1.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffd00;
          args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffcf8;
          uVar7 = Hash<pbrt::Point3<float>,pbrt::Vector3<float>>(args,args_1);
          auVar10 = vcvtusi2ss_avx512f(auVar10,(int)uVar7);
          fVar11 = auVar10._0_4_ * 2.3283064e-10;
        }
        else {
          fVar11 = 1.0;
        }
        if (FVar9 < fVar11) {
          pstd::optional<pbrt::ShapeIntersection>::operator->
                    ((optional<pbrt::ShapeIntersection> *)0x846c4e);
          Interaction::SpawnRay(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          Ray::Ray(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          pstd::optional<pbrt::ShapeIntersection>::operator->
                    ((optional<pbrt::ShapeIntersection> *)0x846cb6);
          Intersect(in_RDX,(Ray *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc);
          bVar5 = pstd::optional::operator_cast_to_bool((optional *)in_RDI);
          if (bVar5) {
            pSVar6 = pstd::optional<pbrt::ShapeIntersection>::operator->
                               ((optional<pbrt::ShapeIntersection> *)0x846d1d);
            FVar9 = pSVar6->tHit;
            pSVar6 = pstd::optional<pbrt::ShapeIntersection>::operator->
                               ((optional<pbrt::ShapeIntersection> *)0x846d44);
            pSVar6->tHit = FVar9 + pSVar6->tHit;
          }
          goto LAB_00846e8c;
        }
      }
    }
    mi = pstd::optional<pbrt::ShapeIntersection>::operator->
                   ((optional<pbrt::ShapeIntersection> *)0x846dce);
    pSVar6 = mi;
    MaterialHandle::MaterialHandle
              ((MaterialHandle *)in_stack_fffffffffffffcb0,
               (MaterialHandle *)in_stack_fffffffffffffca8);
    LightHandle::LightHandle
              ((LightHandle *)in_stack_fffffffffffffcb0,(LightHandle *)in_stack_fffffffffffffca8);
    med = (MediumHandle *)(in_RSI + 0x18);
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffffcb0,(MediumHandle *)in_stack_fffffffffffffca8);
    SurfaceInteraction::SetIntersectionProperties
              (in_stack_fffffffffffffd08,
               (MaterialHandle *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               (LightHandle *)pSVar6,(MediumInterface *)mi,med);
    pstd::optional<pbrt::ShapeIntersection>::optional
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
LAB_00846e8c:
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x846e99);
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> GeometricPrimitive::Intersect(const Ray &r,
                                                                Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);
    // Test intersection against alpha texture, if present
    if (alpha) {
        if (Float a = alpha.Evaluate(si->intr); a < 1) {
            // Potentially skip intersection, depending on stochastic alpha test
            Float u = (a <= 0) ? 1.f : (uint32_t(Hash(r.o, r.d)) * 0x1p-32f);
            if (u > a) {
                // Ignore this intersection and trace a new ray
                Ray rNext = si->intr.SpawnRay(r.d);
                pstd::optional<ShapeIntersection> siNext =
                    Intersect(rNext, tMax - si->tHit);
                if (siNext)
                    siNext->tHit += si->tHit;
                return siNext;
            }
        }
    }

    // Initialize _SurfaceInteraction_ after _Shape_ intersection
    si->intr.SetIntersectionProperties(material, areaLight, &mediumInterface, r.medium);

    return si;
}